

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O3

uint32_t arm_debug_exception_fsr(CPUARMState_conflict *env)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = env->features;
  if ((uVar1 & 0x200000000) == 0) {
    bVar4 = false;
LAB_00629fee:
    if ((uVar1 & 0x100000000) != 0 && !bVar4) {
      if (((env->cp15).hcr_el2 & 0x8000000) != 0) {
        return 0x222;
      }
      if (((env->cp15).mdcr_el2 & 0x100) != 0) {
        return 0x222;
      }
    }
    if ((uVar1 & 0x200000000) != 0) goto LAB_0062a007;
  }
  else {
    if (env->aarch64 == 0) {
      bVar4 = true;
      if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_00629fe3;
    }
    else {
      bVar4 = true;
      if ((~env->pstate & 0xc) != 0) {
LAB_00629fe3:
        bVar4 = ((env->cp15).scr_el3 & 1) == 0;
        goto LAB_00629fee;
      }
    }
LAB_0062a007:
    if ((((uint)uVar1 >> 0x1c & 1) == 0) && (iVar3 = 3, bVar4)) goto LAB_0062a075;
  }
  uVar2 = uVar1 >> 0x1c & 0xffffffff;
  if ((uVar1 & 0x200000000) != 0) {
    uVar2 = 0;
  }
  if ((~uVar1 & 0x210000000) == 0) {
    uVar2 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
  }
  if (((uVar1 & 0x100000000) != 0) &&
     (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
    iVar3 = 1;
    if ((uVar2 & 1) == 0) goto LAB_0062a075;
    uVar2 = (env->cp15).hcr_el2 >> 0x1f;
  }
  iVar3 = 1;
  if ((uVar2 & 1) != 0) {
    return 0x222;
  }
LAB_0062a075:
  if ((((uint)uVar1 >> 0x1a & 1) != 0) &&
     ((*(byte *)((long)&(env->cp15).tcr_el[0].raw_tcr + (ulong)(uint)(iVar3 << 4) + 3) & 0x80) != 0)
     ) {
    return 0x222;
  }
  return 2;
}

Assistant:

static inline uint32_t arm_debug_exception_fsr(CPUARMState *env)
{
    ARMMMUFaultInfo fi = { .type = ARMFault_Debug };
    int target_el = arm_debug_target_el(env);
    bool using_lpae = false;

    if (target_el == 2 || arm_el_is_aa64(env, target_el)) {
        using_lpae = true;
    } else {
        if (arm_feature(env, ARM_FEATURE_LPAE) &&
            (env->cp15.tcr_el[target_el].raw_tcr & TTBCR_EAE)) {
            using_lpae = true;
        }
    }

    if (using_lpae) {
        return arm_fi_to_lfsc(&fi);
    } else {
        return arm_fi_to_sfsc(&fi);
    }
}